

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O2

int nghttp2_session_on_response_headers_received
              (nghttp2_session *session,nghttp2_frame *frame,nghttp2_stream *stream)

{
  int iVar1;
  
  if (stream->state == NGHTTP2_STREAM_OPENING) {
    if (((frame->hd).stream_id != 0) &&
       ((session->server == '\0') == (bool)((byte)(frame->hd).stream_id & 1))) {
      if ((stream->shut_flags & 1) == 0) {
        stream->state = NGHTTP2_STREAM_OPENED;
        iVar1 = session_call_on_begin_headers(session,frame);
        return iVar1;
      }
      iVar1 = session_inflate_handle_invalid_connection
                        (session,frame,-0x1fe,"HEADERS: stream closed");
      return iVar1;
    }
  }
  __assert_fail("stream->state == NGHTTP2_STREAM_OPENING && nghttp2_session_is_my_stream_id(session, frame->hd.stream_id)"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_session.c"
                ,0x10db,
                "int nghttp2_session_on_response_headers_received(nghttp2_session *, nghttp2_frame *, nghttp2_stream *)"
               );
}

Assistant:

int nghttp2_session_on_response_headers_received(nghttp2_session *session,
                                                 nghttp2_frame *frame,
                                                 nghttp2_stream *stream) {
  int rv;
  /* This function is only called if stream->state ==
     NGHTTP2_STREAM_OPENING and stream_id is local side initiated. */
  assert(stream->state == NGHTTP2_STREAM_OPENING &&
         nghttp2_session_is_my_stream_id(session, frame->hd.stream_id));
  if (frame->hd.stream_id == 0) {
    return session_inflate_handle_invalid_connection(
        session, frame, NGHTTP2_ERR_PROTO, "response HEADERS: stream_id == 0");
  }
  if (stream->shut_flags & NGHTTP2_SHUT_RD) {
    /* half closed (remote): from the spec:

       If an endpoint receives additional frames for a stream that is
       in this state it MUST respond with a stream error (Section
       5.4.2) of type STREAM_CLOSED.

       We go further, and make it connection error.
    */
    return session_inflate_handle_invalid_connection(
        session, frame, NGHTTP2_ERR_STREAM_CLOSED, "HEADERS: stream closed");
  }
  stream->state = NGHTTP2_STREAM_OPENED;
  rv = session_call_on_begin_headers(session, frame);
  if (rv != 0) {
    return rv;
  }
  return 0;
}